

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int32_t container_size_in_bytes(container_t *c,uint8_t typecode)

{
  int iVar1;
  int *piVar2;
  uint8_t local_9;
  
  local_9 = typecode;
  piVar2 = (int *)container_unwrap_shared(c,&local_9);
  if (local_9 == '\x01') {
    iVar1 = 0x2000;
  }
  else if (local_9 == '\x03') {
    iVar1 = *piVar2 * 4 + 2;
  }
  else {
    if (local_9 != '\x02') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x11a5,"int32_t container_size_in_bytes(const container_t *, uint8_t)");
    }
    iVar1 = *piVar2 * 2;
  }
  return iVar1;
}

Assistant:

static inline int32_t container_size_in_bytes(
    const container_t *c, uint8_t typecode
){
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_size_in_bytes(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_size_in_bytes(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_size_in_bytes(const_CAST_run(c));
    }
    assert(false);
    __builtin_unreachable();
    return 0;  // unreached
}